

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall cmQtAutoMocUic::SettingsFileWrite(cmQtAutoMocUic *this)

{
  bool bVar1;
  MocSettingsT *pMVar2;
  UicSettingsT *pUVar3;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string error;
  anon_class_8_1_bc116759 SettingAppend;
  string content;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmQtAutoMocUic *local_18;
  cmQtAutoMocUic *this_local;
  
  local_18 = this;
  pMVar2 = MocConst(this);
  if (((pMVar2->SettingsChanged & 1U) != 0) ||
     (pUVar3 = UicConst(this), (pUVar3->SettingsChanged & 1U) != 0)) {
    pLVar4 = Log(this);
    bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar4);
    if (bVar1) {
      pLVar4 = Log(this);
      cmQtAutoGen::Quoted(&local_58,&this->SettingsFile_);
      std::operator+(&local_38,"Writing settings file ",&local_58);
      cmQtAutoGenerator::Logger::Info(pLVar4,GEN,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::string((string *)&SettingAppend);
    error.field_2._8_8_ = (string *)&SettingAppend;
    SettingsFileWrite::anon_class_8_1_bc116759::operator()
              ((anon_class_8_1_bc116759 *)((long)&error.field_2 + 8),"moc",&this->SettingsStringMoc_
              );
    SettingsFileWrite::anon_class_8_1_bc116759::operator()
              ((anon_class_8_1_bc116759 *)((long)&error.field_2 + 8),"uic",&this->SettingsStringUic_
              );
    std::__cxx11::string::string((string *)local_b0);
    bVar1 = cmQtAutoGenerator::FileWrite
                      (&this->SettingsFile_,(string *)&SettingAppend,(string *)local_b0);
    if (!bVar1) {
      pLVar4 = Log(this);
      std::operator+(&local_d0,"Settings file writing failed. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      cmQtAutoGenerator::Logger::ErrorFile(pLVar4,GEN,&this->SettingsFile_,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      cmsys::SystemTools::RemoveFile(&this->SettingsFile_);
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&SettingAppend);
    if (!bVar1) goto LAB_0020483c;
  }
  this_local._7_1_ = 1;
LAB_0020483c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoMocUic::SettingsFileWrite()
{
  // Only write if any setting changed
  if (MocConst().SettingsChanged || UicConst().SettingsChanged) {
    if (Log().Verbose()) {
      Log().Info(GenT::GEN, "Writing settings file " + Quoted(SettingsFile_));
    }
    // Compose settings file content
    std::string content;
    {
      auto SettingAppend = [&content](const char* key,
                                      std::string const& value) {
        if (!value.empty()) {
          content += key;
          content += ':';
          content += value;
          content += '\n';
        }
      };
      SettingAppend("moc", SettingsStringMoc_);
      SettingAppend("uic", SettingsStringUic_);
    }
    // Write settings file
    std::string error;
    if (!cmQtAutoGenerator::FileWrite(SettingsFile_, content, &error)) {
      Log().ErrorFile(GenT::GEN, SettingsFile_,
                      "Settings file writing failed. " + error);
      // Remove old settings file to trigger a full rebuild on the next run
      cmSystemTools::RemoveFile(SettingsFile_);
      return false;
    }
  }
  return true;
}